

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

bool __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
::try_emplace<float,float&>
          (sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
           *this,progress_guarantee i_progress_guarantee,float *i_construction_params)

{
  void *pvVar1;
  put_transaction<float> tranasction;
  put_transaction<float> local_48;
  put_transaction<float> local_28;
  
  try_start_emplace<float,float&>(&local_28,this,i_progress_guarantee,i_construction_params);
  local_48.m_put.m_control_block = local_28.m_put.m_control_block;
  local_48.m_put.m_next_ptr = local_28.m_put.m_next_ptr;
  local_48.m_put.m_user_storage = local_28.m_put.m_user_storage;
  local_48.m_queue = local_28.m_queue;
  local_28.m_put.m_user_storage = (void *)0x0;
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<float>::~put_transaction(&local_28);
  pvVar1 = local_48.m_put.m_user_storage;
  if (local_48.m_put.m_user_storage != (void *)0x0) {
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::put_transaction<float>::commit(&local_48);
  }
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<float>::~put_transaction(&local_48);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool
          try_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(std::declval<sp_heter_queue>().template try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }